

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool hasLSTMWeightParamOfType(LSTMWeightParams *params,WeightParamType *type)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  WeightParams *pWVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  pWVar6 = params->inputgateweightmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
  }
  iVar1 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar7 = (0 < iVar1) + 1;
  if (sVar2 == 0) {
    uVar7 = (uint)(0 < iVar1);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar10 = (uint)(sVar4 == 0);
  uVar7 = (uVar7 - (sVar3 == 0)) + 2;
  uVar8 = 4;
  if (uVar7 - uVar10 < 2) {
    uVar8 = 5;
    if (uVar7 != uVar10) {
      uVar8 = (uint)(iVar1 < 1);
    }
    if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar7 != uVar10)) &&
        (((sVar3 == 0 ||
          (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (uVar8 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 ||
         (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (uVar8 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      uVar8 = 5;
    }
  }
  uVar7 = (uint)type;
  if (uVar8 != uVar7) {
    pWVar6 = params->forgetgateweightmatrix_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    iVar1 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar10 = (0 < iVar1) + 1;
    if (sVar2 == 0) {
      uVar10 = (uint)(0 < iVar1);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar8 = (uint)(sVar4 == 0);
    uVar10 = (uVar10 - (sVar3 == 0)) + 2;
    uVar9 = 4;
    if (uVar10 - uVar8 < 2) {
      uVar9 = 5;
      if (uVar10 != uVar8) {
        uVar9 = (uint)(iVar1 < 1);
      }
      if ((((sVar2 == 0) && (iVar1 < 1)) && (uVar10 != uVar8)) &&
         ((((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
           (uVar9 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar4 == 0 ||
            (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
           (uVar9 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
        uVar9 = 5;
      }
    }
    if (uVar9 != uVar7) {
      pWVar6 = params->blockinputweightmatrix_;
      if (pWVar6 == (WeightParams *)0x0) {
        pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar6->floatvalue_).current_size_;
      sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
      uVar10 = (0 < iVar1) + 1;
      if (sVar2 == 0) {
        uVar10 = (uint)(0 < iVar1);
      }
      sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
      sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar4 == 0);
      uVar10 = (uVar10 - (sVar3 == 0)) + 2;
      uVar9 = 4;
      if (uVar10 - uVar8 < 2) {
        uVar9 = 5;
        if (uVar10 != uVar8) {
          uVar9 = (uint)(iVar1 < 1);
        }
        if ((((sVar2 == 0) && (iVar1 < 1)) && (uVar10 != uVar8)) &&
           ((((sVar3 == 0 ||
              (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
             || (uVar9 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar4 == 0 ||
              (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
             || (uVar9 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
          uVar9 = 5;
        }
      }
      if (uVar9 != uVar7) {
        pWVar6 = params->outputgateweightmatrix_;
        if (pWVar6 == (WeightParams *)0x0) {
          pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        iVar1 = (pWVar6->floatvalue_).current_size_;
        sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
        uVar10 = (0 < iVar1) + 1;
        if (sVar2 == 0) {
          uVar10 = (uint)(0 < iVar1);
        }
        sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
        sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar4 == 0);
        uVar10 = (uVar10 - (sVar3 == 0)) + 2;
        uVar9 = 4;
        if (uVar10 - uVar8 < 2) {
          uVar9 = 5;
          if (uVar10 != uVar8) {
            uVar9 = (uint)(iVar1 < 1);
          }
          if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar10 != uVar8)) &&
              (((sVar3 == 0 ||
                (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
               || (uVar9 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar4 == 0 ||
               (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
              || (uVar9 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
            uVar9 = 5;
          }
        }
        if (uVar9 != uVar7) {
          pWVar6 = params->inputgaterecursionmatrix_;
          if (pWVar6 == (WeightParams *)0x0) {
            pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
          }
          iVar1 = (pWVar6->floatvalue_).current_size_;
          sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
          uVar10 = (0 < iVar1) + 1;
          if (sVar2 == 0) {
            uVar10 = (uint)(0 < iVar1);
          }
          sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
          sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
          uVar8 = (uint)(sVar4 == 0);
          uVar10 = (uVar10 - (sVar3 == 0)) + 2;
          uVar9 = 4;
          if (uVar10 - uVar8 < 2) {
            uVar9 = 5;
            if (uVar10 != uVar8) {
              uVar9 = (uint)(iVar1 < 1);
            }
            if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar10 != uVar8)) &&
                (((sVar3 == 0 ||
                  (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_
                  )) || (uVar9 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
               (((sVar4 == 0 ||
                 (pWVar6 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)
                 ) || (uVar9 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
              uVar9 = 5;
            }
          }
          if (uVar9 != uVar7) {
            pWVar6 = params->forgetgaterecursionmatrix_;
            if (pWVar6 == (WeightParams *)0x0) {
              pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
            }
            iVar1 = (pWVar6->floatvalue_).current_size_;
            sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
            uVar10 = (0 < iVar1) + 1;
            if (sVar2 == 0) {
              uVar10 = (uint)(0 < iVar1);
            }
            sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
            sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
            uVar8 = (uint)(sVar4 == 0);
            uVar10 = (uVar10 - (sVar3 == 0)) + 2;
            uVar9 = 4;
            if (uVar10 - uVar8 < 2) {
              uVar9 = 5;
              if (uVar10 != uVar8) {
                uVar9 = (uint)(iVar1 < 1);
              }
              if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar10 != uVar8)) &&
                  (((sVar3 == 0 ||
                    (pWVar6 == (WeightParams *)
                               &CoreML::Specification::_WeightParams_default_instance_)) ||
                   (uVar9 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
                 (((sVar4 == 0 ||
                   (pWVar6 == (WeightParams *)
                              &CoreML::Specification::_WeightParams_default_instance_)) ||
                  (uVar9 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
                uVar9 = 5;
              }
            }
            if (uVar9 != uVar7) {
              pWVar6 = params->blockinputrecursionmatrix_;
              if (pWVar6 == (WeightParams *)0x0) {
                pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
              }
              bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)((ulong)type & 0xffffffff));
              if (!bVar5) {
                pWVar6 = params->outputgaterecursionmatrix_;
                if (pWVar6 == (WeightParams *)0x0) {
                  pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
                }
                bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)((ulong)type & 0xffffffff));
                if (!bVar5) {
                  pWVar6 = params->inputgatebiasvector_;
                  if (pWVar6 == (WeightParams *)0x0) {
                    pWVar6 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_
                    ;
                  }
                  bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)((ulong)type & 0xffffffff));
                  if (!bVar5) {
                    pWVar6 = params->forgetgatebiasvector_;
                    if (pWVar6 == (WeightParams *)0x0) {
                      pWVar6 = (WeightParams *)
                               &CoreML::Specification::_WeightParams_default_instance_;
                    }
                    bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)((ulong)type & 0xffffffff)
                                               );
                    if (!bVar5) {
                      pWVar6 = params->blockinputbiasvector_;
                      if (pWVar6 == (WeightParams *)0x0) {
                        pWVar6 = (WeightParams *)
                                 &CoreML::Specification::_WeightParams_default_instance_;
                      }
                      bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)
                                                         ((ulong)type & 0xffffffff));
                      if (!bVar5) {
                        pWVar6 = params->outputgatebiasvector_;
                        if (pWVar6 == (WeightParams *)0x0) {
                          pWVar6 = (WeightParams *)
                                   &CoreML::Specification::_WeightParams_default_instance_;
                        }
                        bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)
                                                           ((ulong)type & 0xffffffff));
                        if (!bVar5) {
                          pWVar6 = params->inputgatepeepholevector_;
                          if (pWVar6 == (WeightParams *)0x0) {
                            pWVar6 = (WeightParams *)
                                     &CoreML::Specification::_WeightParams_default_instance_;
                          }
                          bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)
                                                             ((ulong)type & 0xffffffff));
                          if (!bVar5) {
                            pWVar6 = params->forgetgatepeepholevector_;
                            if (pWVar6 == (WeightParams *)0x0) {
                              pWVar6 = (WeightParams *)
                                       &CoreML::Specification::_WeightParams_default_instance_;
                            }
                            bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)
                                                               ((ulong)type & 0xffffffff));
                            if (!bVar5) {
                              pWVar6 = params->outputgatepeepholevector_;
                              if (pWVar6 == (WeightParams *)0x0) {
                                pWVar6 = (WeightParams *)
                                         &CoreML::Specification::_WeightParams_default_instance_;
                              }
                              bVar5 = isWeightParamOfType(pWVar6,(WeightParamType *)
                                                                 ((ulong)type & 0xffffffff));
                              return bVar5;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool hasLSTMWeightParamOfType(const Specification::LSTMWeightParams& params,
                                               const WeightParamType& type) {

    return (isWeightParamOfType(params.inputgateweightmatrix(), type) ||
            isWeightParamOfType(params.forgetgateweightmatrix(), type) ||
            isWeightParamOfType(params.blockinputweightmatrix(), type) ||
            isWeightParamOfType(params.outputgateweightmatrix(), type) ||

            isWeightParamOfType(params.inputgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.forgetgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.blockinputrecursionmatrix(), type) ||
            isWeightParamOfType(params.outputgaterecursionmatrix(), type) ||

            isWeightParamOfType(params.inputgatebiasvector(), type) ||
            isWeightParamOfType(params.forgetgatebiasvector(), type) ||
            isWeightParamOfType(params.blockinputbiasvector(), type) ||
            isWeightParamOfType(params.outputgatebiasvector(), type) ||

            isWeightParamOfType(params.inputgatepeepholevector(), type) ||
            isWeightParamOfType(params.forgetgatepeepholevector(), type) ||
            isWeightParamOfType(params.outputgatepeepholevector(), type));
}